

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastAdderFast(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int fSign,int CarryIn)

{
  int Log2;
  int *pAdd0_00;
  int *pAdd1_00;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  size_t __nmemb;
  int iVar6;
  long lVar7;
  
  Log2 = Abc_Base2Log(nBits);
  iVar4 = 1 << ((byte)Log2 & 0x1f);
  __nmemb = (size_t)(iVar4 + 1);
  pAdd0_00 = (int *)calloc(__nmemb,4);
  pAdd1_00 = (int *)calloc(__nmemb,4);
  uVar3 = 0;
  uVar1 = 0;
  if (0 < nBits) {
    uVar1 = (ulong)(uint)nBits;
  }
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pAdd0_00[uVar3] = pAdd0[uVar3];
    pAdd1_00[uVar3] = pAdd1[uVar3];
  }
  lVar7 = (long)nBits;
  for (; (long)uVar1 < (long)iVar4; uVar1 = uVar1 + 1) {
    if (fSign == 0) {
      iVar5 = 0;
      iVar6 = 0;
    }
    else {
      iVar5 = pAdd0[lVar7 + -1];
      iVar6 = pAdd1[lVar7 + -1];
    }
    pAdd0_00[uVar1] = iVar5;
    pAdd1_00[uVar1] = iVar6;
  }
  Wlc_BlastAdderFast_int(pNew,pAdd0_00,pAdd1_00,Log2,CarryIn);
  for (lVar2 = 0; lVar2 <= lVar7; lVar2 = lVar2 + 1) {
    pAdd0[lVar2] = pAdd0_00[lVar2];
  }
  free(pAdd0_00);
  free(pAdd1_00);
  return;
}

Assistant:

void Wlc_BlastAdderFast( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int fSign, int CarryIn ) // result is in pAdd0
{
    int i, Log2 = Abc_Base2Log(nBits);
    int * pAdd0n = ABC_CALLOC( int, (1<<Log2)+1 );
    int * pAdd1n = ABC_CALLOC( int, (1<<Log2)+1 );
    for ( i = 0; i < nBits; i++ )
    {
        pAdd0n[i] = pAdd0[i];
        pAdd1n[i] = pAdd1[i];
    }
    for ( ; i < (1<<Log2); i++ )
    {
        pAdd0n[i] = fSign ? pAdd0[nBits-1] : 0;
        pAdd1n[i] = fSign ? pAdd1[nBits-1] : 0;
    }
    Wlc_BlastAdderFast_int( pNew, pAdd0n, pAdd1n, Log2, CarryIn );
    for ( i = 0; i <= nBits; i++ )
        pAdd0[i] = pAdd0n[i];
    ABC_FREE(pAdd0n);
    ABC_FREE(pAdd1n);
}